

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma_dist.hpp
# Opt level: O1

result_type_conflict3 * __thiscall
trng::gamma_dist<long_double>::pdf
          (result_type_conflict3 *__return_storage_ptr__,gamma_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *in_RAX;
  
  if ((longdouble)0 <= x._0_10_) {
    logl();
    lgammal();
    in_RAX = (result_type_conflict3 *)expl();
  }
  return in_RAX;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= P.theta();
      return math::exp((P.kappa() - 1) * math::ln(x) - x - math::ln_Gamma(P.kappa())) /
             (P.theta());
    }